

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnvmbcs.cpp
# Opt level: O2

void ucnv_MBCSGetUnicodeSetForUnicode_63
               (UConverterSharedData *sharedData,USetAdder *sa,UConverterUnicodeSet which,
               UErrorCode *pErrorCode)

{
  ucnv_MBCSGetFilteredUnicodeSetForUnicode_63
            (sharedData,sa,which,(uint)((sharedData->mbcs).outputType == 0xdb),pErrorCode);
  return;
}

Assistant:

U_CFUNC void
ucnv_MBCSGetUnicodeSetForUnicode(const UConverterSharedData *sharedData,
                                 const USetAdder *sa,
                                 UConverterUnicodeSet which,
                                 UErrorCode *pErrorCode) {
    ucnv_MBCSGetFilteredUnicodeSetForUnicode(
        sharedData, sa, which,
        sharedData->mbcs.outputType==MBCS_OUTPUT_DBCS_ONLY ?
            UCNV_SET_FILTER_DBCS_ONLY :
            UCNV_SET_FILTER_NONE,
        pErrorCode);
}